

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_repl.c
# Opt level: O0

repl_p_entry * repl_p_lru_insert(repl_p_head *head,void *element,repl_p_entry **ptr_entry)

{
  repl_p_entry **pprVar1;
  bool bVar2;
  int rv;
  repl_p_entry *entry;
  repl_p_entry **ptr_entry_local;
  void *element_local;
  repl_p_head *head_local;
  
  head_local = (repl_p_head *)Zalloc(0x20);
  if (head_local == (repl_p_head *)0x0) {
    head_local = (repl_p_head *)0x0;
  }
  else {
    *(void **)((long)&head_local->lock + 0x10) = element;
    *(repl_p_entry ***)((long)&head_local->lock + 0x18) = ptr_entry;
    pprVar1 = *(repl_p_entry ***)((long)&head_local->lock + 0x18);
    LOCK();
    bVar2 = *pprVar1 == (repl_p_entry *)0x0;
    if (bVar2) {
      *pprVar1 = (repl_p_entry *)head_local;
    }
    UNLOCK();
    if (!bVar2) {
      abort();
    }
    util_mutex_lock(&head->lock);
    vmemcache_entry_acquire((cache_entry *)element);
    (head_local->lock).align = 0;
    *(repl_p_entry ***)((long)&head_local->lock + 8) = (head->first).tqh_last;
    *(head->first).tqh_last = (repl_p_entry *)head_local;
    (head->first).tqh_last = (repl_p_entry **)head_local;
    util_mutex_unlock(&head->lock);
  }
  return (repl_p_entry *)head_local;
}

Assistant:

static struct repl_p_entry *
repl_p_lru_insert(struct repl_p_head *head, void *element,
			struct repl_p_entry **ptr_entry)
{
	struct repl_p_entry *entry = Zalloc(sizeof(struct repl_p_entry));
	if (entry == NULL)
		return NULL;

	entry->data = element;

	ASSERTne(ptr_entry, NULL);
	entry->ptr_entry = ptr_entry;

	/*
	 * 'util_bool_compare_and_swap64' must always succeed here,
	 * because this entry with ptr_entry=NULL has been considered as busy
	 * so it has never been used so far. This is the first time we set
	 * the 'entry->ptr_entry' to 'entry'.
	 */
	int rv = util_bool_compare_and_swap64(entry->ptr_entry, NULL, entry);
	if (rv == 0) {
		FATAL(
			"repl_p_lru_insert(): failed to initialize pointer to the LRU list");
	}

	util_mutex_lock(&head->lock);

	vmemcache_entry_acquire(element);
	TAILQ_INSERT_TAIL(&head->first, entry, node);

	util_mutex_unlock(&head->lock);

	return entry;
}